

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cc
# Opt level: O0

void __thiscall avro::Name::fullname(Name *this,string *name)

{
  string *in_RSI;
  string *in_RDI;
  size_type n;
  string local_58 [32];
  string local_38 [32];
  long local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::find_last_of((char)in_RSI,0x2e);
  if (local_18 == -1) {
    std::__cxx11::string::operator=(in_RDI + 0x20,local_10);
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)local_10);
    std::__cxx11::string::operator=(in_RDI,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::substr((ulong)local_58,(ulong)local_10);
    std::__cxx11::string::operator=(in_RDI + 0x20,local_58);
    std::__cxx11::string::~string(local_58);
  }
  check((Name *)n);
  return;
}

Assistant:

void Name::fullname(const string& name)
{
    string::size_type n = name.find_last_of('.');
    if (n == string::npos) {
        simpleName_ = name;
        ns_.clear();
    } else {
        ns_ = name.substr(0, n);
        simpleName_ = name.substr(n + 1);
    }
    check();
}